

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall socketsys::IOException::IOException(IOException *this,char *error,int code)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,code);
  std::operator+(&bStack_58,error,&local_38);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_00144d20;
  return;
}

Assistant:

explicit IOException(const char* error, int code) : std::runtime_error(error + std::to_string(code)) {}